

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int apply_stream_frame(quicly_stream_t *stream,quicly_stream_frame_t *frame)

{
  quicly_context_t *pqVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long in_RSI;
  st_quicly_conn_t *in_RDI;
  quicly_conn_t *_conn_1;
  void *apply_src;
  uint64_t buf_offset;
  size_t apply_len;
  uint64_t newly_received;
  uint64_t max_stream_data;
  quicly_conn_t *_conn;
  int ret;
  quicly_stream_t *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  long lVar5;
  size_t *in_stack_ffffffffffffffc8;
  st_quicly_stream_t *in_stack_ffffffffffffffd0;
  quicly_context_t *state;
  int err;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_4;
  
  state = (in_RDI->super).ctx;
  if ((quicly_trace_fp != (FILE *)0x0) &&
     (iVar2 = ptls_skip_tracing((ptls_t *)state[8].stream_open), iVar2 == 0)) {
    QUICLY_STREAM_RECEIVE
              ((st_quicly_conn_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (int64_t)state,in_stack_ffffffffffffffd0,(uint64_t)in_stack_ffffffffffffffc8,
               in_stack_ffffffffffffffc0);
  }
  iVar2 = quicly_recvstate_transfer_complete
                    ((quicly_recvstate_t *)((in_RDI->super).local.cid_set.cids[1].cid.cid + 0x10));
  if (iVar2 == 0) {
    if (*(long *)&(in_RDI->super).state < 0) {
      if (((in_RDI->super).ctx)->tls->update_open_count <
          (ptls_update_open_count_t *)(*(long *)(in_RSI + 0x10) + *(long *)(in_RSI + 0x20))) {
        return 0x2000d;
      }
    }
    else {
      in_stack_ffffffffffffffd0 =
           (st_quicly_stream_t *)(*(long *)(in_RSI + 0x10) + *(long *)(in_RSI + 0x20));
      if ((long)(ulong)*(uint *)((long)&(in_RDI->super).local.address + 0x10) <
          (long)in_stack_ffffffffffffffd0 - *(long *)(in_RDI->super).local.cid_set.cids[2].cid.cid)
      {
        return 0x20003;
      }
      if (*(st_quicly_stream_t **)
           (*(long *)((in_RDI->super).local.cid_set.cids[1].cid.cid + 0x10) +
            (*(long *)((in_RDI->super).local.cid_set.cids[1].stateless_reset_token + 3) + -1) * 0x10
           + 8) < in_stack_ffffffffffffffd0) {
        in_stack_ffffffffffffffc8 =
             (size_t *)
             ((long)in_stack_ffffffffffffffd0 -
             *(long *)(*(long *)((in_RDI->super).local.cid_set.cids[1].cid.cid + 0x10) +
                       (*(long *)((in_RDI->super).local.cid_set.cids[1].stateless_reset_token + 3) +
                       -1) * 0x10 + 8));
        if ((in_RDI->super).ctx[5].transport_params.max_udp_payload_size <
            (in_RDI->super).ctx[5].transport_params.max_streams_uni +
            (long)in_stack_ffffffffffffffc8) {
          return 0x20003;
        }
        pqVar1 = (in_RDI->super).ctx;
        pqVar1[5].transport_params.max_streams_uni =
             (long)in_stack_ffffffffffffffc8 + pqVar1[5].transport_params.max_streams_uni;
      }
    }
    lVar5 = *(long *)(in_RSI + 0x20);
    local_4 = quicly_recvstate_update
                        ((quicly_recvstate_t *)state,(uint64_t)in_stack_ffffffffffffffd0,
                         in_stack_ffffffffffffffc8,(int)((ulong)lVar5 >> 0x20),
                         in_stack_ffffffffffffffb8);
    if (local_4 == 0) {
      if ((lVar5 != 0) ||
         (iVar2 = quicly_recvstate_transfer_complete
                            ((quicly_recvstate_t *)
                             ((in_RDI->super).local.cid_set.cids[1].cid.cid + 0x10)), iVar2 != 0)) {
        lVar3 = ((*(long *)(in_RSI + 0x10) + *(long *)(in_RSI + 0x20)) - lVar5) -
                *(long *)(in_RDI->super).local.cid_set.cids[2].cid.cid;
        lVar4 = (*(long *)(in_RSI + 0x18) + *(long *)(in_RSI + 0x20)) - lVar5;
        in_stack_ffffffffffffffa8 = (quicly_stream_t *)(in_RDI->super).ctx;
        if ((quicly_trace_fp != (FILE *)0x0) &&
           (iVar2 = ptls_skip_tracing((ptls_t *)
                                      in_stack_ffffffffffffffa8[7].recvstate.received._initial.end),
           iVar2 == 0)) {
          QUICLY_STREAM_ON_RECEIVE
                    (in_RDI,in_RSI,(st_quicly_stream_t *)CONCAT44(local_4,in_stack_ffffffffffffffe0)
                     ,(size_t)state,in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
        }
        (**(code **)(*(long *)&(in_RDI->super).local.cid_set.plaintext + 0x20))
                  (in_RDI,lVar3,lVar4,lVar5);
        if (2 < *(uint *)&((in_RDI->super).ctx)->initial_egress_max_udp_payload_size) {
          return 0xff06;
        }
      }
      err = (int)((ulong)state >> 0x20);
      iVar2 = should_send_max_stream_data(in_stack_ffffffffffffffa8);
      if (iVar2 != 0) {
        sched_stream_control((quicly_stream_t *)0x14fb0b);
      }
      iVar2 = stream_is_destroyable(in_stack_ffffffffffffffa8);
      if (iVar2 != 0) {
        destroy_stream((quicly_stream_t *)CONCAT44(local_4,in_stack_ffffffffffffffe0),err);
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int apply_stream_frame(quicly_stream_t *stream, quicly_stream_frame_t *frame)
{
    int ret;

    QUICLY_PROBE(STREAM_RECEIVE, stream->conn, stream->conn->stash.now, stream, frame->offset, frame->data.len);

    if (quicly_recvstate_transfer_complete(&stream->recvstate))
        return 0;

    /* flow control */
    if (stream->stream_id >= 0) {
        /* STREAMs */
        uint64_t max_stream_data = frame->offset + frame->data.len;
        if ((int64_t)stream->_recv_aux.window < (int64_t)max_stream_data - (int64_t)stream->recvstate.data_off)
            return QUICLY_TRANSPORT_ERROR_FLOW_CONTROL;
        if (stream->recvstate.received.ranges[stream->recvstate.received.num_ranges - 1].end < max_stream_data) {
            uint64_t newly_received =
                max_stream_data - stream->recvstate.received.ranges[stream->recvstate.received.num_ranges - 1].end;
            if (stream->conn->ingress.max_data.bytes_consumed + newly_received >
                stream->conn->ingress.max_data.sender.max_committed)
                return QUICLY_TRANSPORT_ERROR_FLOW_CONTROL;
            stream->conn->ingress.max_data.bytes_consumed += newly_received;
            /* FIXME send MAX_DATA if necessary */
        }
    } else {
        /* CRYPTO streams; maybe add different limit for 1-RTT CRYPTO? */
        if (frame->offset + frame->data.len > stream->conn->super.ctx->max_crypto_bytes)
            return QUICLY_TRANSPORT_ERROR_CRYPTO_BUFFER_EXCEEDED;
    }

    /* update recvbuf */
    size_t apply_len = frame->data.len;
    if ((ret = quicly_recvstate_update(&stream->recvstate, frame->offset, &apply_len, frame->is_fin,
                                       stream->_recv_aux.max_ranges)) != 0)
        return ret;

    if (apply_len != 0 || quicly_recvstate_transfer_complete(&stream->recvstate)) {
        uint64_t buf_offset = frame->offset + frame->data.len - apply_len - stream->recvstate.data_off;
        const void *apply_src = frame->data.base + frame->data.len - apply_len;
        QUICLY_PROBE(STREAM_ON_RECEIVE, stream->conn, stream->conn->stash.now, stream, (size_t)buf_offset, apply_src, apply_len);
        stream->callbacks->on_receive(stream, (size_t)buf_offset, apply_src, apply_len);
        if (stream->conn->super.state >= QUICLY_STATE_CLOSING)
            return QUICLY_ERROR_IS_CLOSING;
    }

    if (should_send_max_stream_data(stream))
        sched_stream_control(stream);

    if (stream_is_destroyable(stream))
        destroy_stream(stream, 0);

    return 0;
}